

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStepInnerStepper_Resize
              (MRIStepInnerStepper stepper,ARKVecResizeFn resize,void *resize_data,
              sunindextype lrw_diff,sunindextype liw_diff,N_Vector tmpl)

{
  ARKVecResizeFn in_RCX;
  long *in_RDI;
  void *in_R8;
  undefined8 in_R9;
  long *unaff_retaddr;
  int retval;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == (long *)0x0) {
    iVar1 = -0x16;
  }
  else {
    iVar1 = arkResizeVecArray(in_RCX,in_R8,(int)((ulong)in_R9 >> 0x20),
                              (N_Vector)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              (N_Vector **)(in_RDI + 0xd),(sunindextype)in_R8,in_RDI,
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              unaff_retaddr);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = -0x14;
    }
  }
  return iVar1;
}

Assistant:

int mriStepInnerStepper_Resize(MRIStepInnerStepper stepper, ARKVecResizeFn resize,
                               void* resize_data, sunindextype lrw_diff,
                               sunindextype liw_diff, N_Vector tmpl)
{
  int retval;

  if (stepper == NULL) { return ARK_ILL_INPUT; }

  retval = arkResizeVecArray(resize, resize_data, stepper->nforcing_allocated,
                             tmpl, &(stepper->forcing), lrw_diff,
                             &(stepper->lrw), liw_diff, &(stepper->liw));
  if (retval != ARK_SUCCESS) { return (ARK_MEM_FAIL); }

  return (ARK_SUCCESS);
}